

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O1

void __thiscall DNSResolve::SendRequest(DNSResolve *this,string *hostname,DNS_TYPE type)

{
  ushort uVar1;
  ushort uVar2;
  char *__s;
  bool bVar3;
  char *encoded_str;
  size_t sVar4;
  DNSResolve *this_00;
  DNSResolve *encoded_str_size;
  _List_node_base *p_Var5;
  uint16_t qclass;
  uint16_t qtype;
  undefined2 local_54;
  undefined2 local_52;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  __s = this->dns_packet_;
  memset(__s,0,(ulong)this->kDnsClassSzie +
               (ulong)this->kDnsTypeSize + (ulong)this->kMaxDownmainNameLen + 0xc);
  __s[0] = '\0';
  __s[1] = '\0';
  __s[2] = '\x01';
  __s[3] = '\0';
  __s[4] = '\0';
  __s[5] = '\x01';
  __s[6] = '\0';
  __s[7] = '\0';
  __s[8] = '\0';
  __s[9] = '\0';
  __s[10] = '\0';
  __s[0xb] = '\0';
  local_52 = 0x100;
  local_54 = 0x100;
  encoded_str_size = (DNSResolve *)(hostname->_M_string_length + 2);
  this_00 = encoded_str_size;
  encoded_str = (char *)operator_new__((ulong)encoded_str_size);
  bVar3 = EncodeDotStr(this_00,(hostname->_M_dataplus)._M_p,encoded_str,(size_t)encoded_str_size);
  if (bVar3) {
    sVar4 = strlen(encoded_str);
    memcpy(__s + 0xc,encoded_str,sVar4 + 1);
    memcpy(__s + sVar4 + 0xd,&local_52,(ulong)this->kDnsTypeSize);
    memcpy(__s + sVar4 + 0xd + this->kDnsTypeSize,&local_54,(ulong)this->kDnsClassSzie);
    operator_delete(encoded_str);
    p_Var5 = (this->servers_).super__List_base<sockaddr_in,_std::allocator<sockaddr_in>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var5 != (_List_node_base *)&this->servers_) {
      uVar1 = this->kDnsTypeSize;
      uVar2 = this->kDnsClassSzie;
      do {
        BufferSendTo(this->dns_socket_,this->dns_packet_,
                     (uint)uVar2 + (uint)uVar1 + (int)sVar4 + 0xd,(sockaddr *)(p_Var5 + 1),0x10);
        p_Var5 = p_Var5->_M_next;
      } while (p_Var5 != (_List_node_base *)&this->servers_);
    }
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [error] ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"EncodeDotStr Failed\n",0x14);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    operator_delete(encoded_str);
  }
  return;
}

Assistant:

void DNSResolve::SendRequest(const string& hostname, DNS_TYPE type)
{
    char *write_dns_packet_ptr = dns_packet_;
    memset(write_dns_packet_ptr, 0, kDnsPacketMaxSize);

    //fill dns request header
    DNSHeader *dns_header = (DNSHeader*)write_dns_packet_ptr;
    dns_header->trans_id = 0;
    dns_header->flags = htons(0x0100);
    dns_header->question_count = htons(0x0001);
    dns_header->answer_count = 0x0000;
    dns_header->authority_count = 0x0000;
    dns_header->additional_count = 0x0000;

    //set dns request packet
    uint16_t qtype = htons(0x0001);
    uint16_t qclass = htons(0x0001);
    size_t domain_name_len = hostname.length();
    char *encode_domain_name = new char[domain_name_len + 2];
    if (encode_domain_name == NULL)
    {
        LOGE << "malloc failed\n";
        return;
    }
    if (!EncodeDotStr(hostname.c_str(), encode_domain_name, domain_name_len + 2))
    {
        LOGE << "EncodeDotStr Failed\n";
        delete encode_domain_name;
        return;
    }

    //fill dns request packet
    size_t encode_domain_name_len = strlen(encode_domain_name) + 1;
    memcpy(write_dns_packet_ptr += sizeof(DNSHeader), encode_domain_name, encode_domain_name_len);
    memcpy(write_dns_packet_ptr += encode_domain_name_len, (char*)(&qtype), kDnsTypeSize);
    memcpy(write_dns_packet_ptr += kDnsTypeSize, (char*)(&qclass), kDnsClassSzie);
    delete encode_domain_name;

    size_t dns_packet_size = sizeof(DNSHeader) + encode_domain_name_len + kDnsTypeSize + kDnsClassSzie;
    for (auto& dns_server_addr : servers_)
    {
        BufferSendTo(dns_socket_, dns_packet_, dns_packet_size, (sockaddr*)&dns_server_addr, sizeof(dns_server_addr));
    }
}